

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O1

REF_STATUS ref_histogram_print_stat(REF_HISTOGRAM ref_histogram)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  printf("mom ");
  if (0 < ref_histogram->nstat) {
    uVar3 = 0;
    do {
      printf("%12.8f(%d)",ref_histogram->stats[uVar3],uVar3 & 0xffffffff);
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)ref_histogram->nstat);
  }
  putchar(10);
  dVar1 = ref_histogram->stats[3];
  dVar4 = pow(ref_histogram->stats[2],1.5);
  dVar6 = dVar4 * 1e+20;
  if (dVar6 <= -dVar6) {
    dVar6 = -dVar6;
  }
  dVar5 = dVar1;
  if (dVar1 <= -dVar1) {
    dVar5 = -dVar1;
  }
  dVar9 = ref_histogram->stats[2];
  dVar2 = ref_histogram->stats[4];
  dVar9 = dVar9 * dVar9;
  dVar8 = dVar9 * 1e+20;
  if (dVar8 <= -dVar8) {
    dVar8 = -dVar8;
  }
  dVar7 = dVar2;
  if (dVar2 <= -dVar2) {
    dVar7 = -dVar2;
  }
  printf("skewness %12.8f kurtosis %12.8f\n",-(ulong)(dVar5 < dVar6) & (ulong)(dVar1 / dVar4),
         -(ulong)(dVar7 < dVar8) & (ulong)(dVar2 / dVar9 + -3.0));
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_print_stat(REF_HISTOGRAM ref_histogram) {
  REF_INT i;
  REF_DBL skewness, kurtosis, n, d;

  printf("mom ");
  for (i = 0; i < ref_histogram_nstat(ref_histogram); i++)
    printf("%12.8f(%d)", ref_histogram_stat(ref_histogram, i), i);
  printf("\n");

  n = ref_histogram_stat(ref_histogram, 3);
  d = pow(ref_histogram_stat(ref_histogram, 2), 1.5);
  skewness = 0.0;
  if (ref_math_divisible(n, d)) skewness = n / d;

  n = ref_histogram_stat(ref_histogram, 4);
  d = pow(ref_histogram_stat(ref_histogram, 2), 2);
  kurtosis = 0.0;
  if (ref_math_divisible(n, d)) kurtosis = n / d - 3.0;

  printf("skewness %12.8f kurtosis %12.8f\n", skewness, kurtosis);

  return REF_SUCCESS;
}